

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

const_iterator __thiscall
VulkanHppGenerator::findStructMemberIt
          (VulkanHppGenerator *this,string *name,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *memberData)

{
  MemberData *pMVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  MemberData *pMVar3;
  
  pMVar3 = (memberData->
           super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (memberData->
           super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar3 != pMVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      if ((pMVar3->name)._M_string_length == __n) {
        if (__n == 0) {
          return (const_iterator)pMVar3;
        }
        iVar2 = bcmp((pMVar3->name)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) {
          return (const_iterator)pMVar3;
        }
      }
      pMVar3 = pMVar3 + 1;
    } while (pMVar3 != pMVar1);
  }
  return (const_iterator)pMVar3;
}

Assistant:

std::vector<VulkanHppGenerator::MemberData>::const_iterator VulkanHppGenerator::findStructMemberIt( std::string const &             name,
                                                                                                    std::vector<MemberData> const & memberData ) const
{
  return std::ranges::find_if( memberData, [&name]( MemberData const & md ) { return md.name == name; } );
}